

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff.cxx
# Opt level: O0

void __thiscall vigra::TIFFDecoderImpl::nextScanline(TIFFDecoderImpl *this)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined2 uVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  uint i_1;
  uint n;
  UInt8 *buf;
  uint i;
  tsize_t size;
  char *in_stack_ffffffffffffffc8;
  uint local_28;
  char *local_20;
  uint local_14;
  
  uVar6 = *(int *)((long)&in_RDI[1].field_2 + 4) + 1;
  *(uint *)((long)&in_RDI[1].field_2 + 4) = uVar6;
  if (*(uint *)((long)&in_RDI[1].field_2 + 8) <= uVar6) {
    *(undefined4 *)((long)&in_RDI[1].field_2 + 4) = 0;
    if (*(short *)((long)&in_RDI[2]._M_string_length + 2) == 2) {
      uVar5 = TIFFScanlineSize(*(undefined8 *)(in_RDI + 1));
      for (local_14 = 0; local_14 < *(ushort *)&in_RDI[2].field_0x4; local_14 = local_14 + 1) {
        uVar2 = *(undefined8 *)(in_RDI + 1);
        uVar3 = *(undefined8 *)(in_RDI[1]._M_string_length + (ulong)local_14 * 8);
        iVar1 = (int)in_RDI[4]._M_string_length;
        *(int *)&in_RDI[4]._M_string_length = iVar1 + 1;
        TIFFReadScanline(uVar2,uVar3,iVar1,uVar5);
      }
    }
    else {
      uVar2 = *(undefined8 *)(in_RDI + 1);
      uVar3 = *(undefined8 *)in_RDI[1]._M_string_length;
      iVar1 = (int)in_RDI[4]._M_string_length;
      *(int *)&in_RDI[4]._M_string_length = iVar1 + 1;
      TIFFReadScanline(uVar2,uVar3,iVar1,0);
    }
    if ((((short)in_RDI[2]._M_string_length == 0) && (*(short *)&in_RDI[2].field_0x4 == 1)) &&
       (bVar4 = std::operator==(in_RDI,in_stack_ffffffffffffffc8), bVar4)) {
      local_20 = *(char **)in_RDI[1]._M_string_length;
      uVar6 = TIFFScanlineSize(*(undefined8 *)(in_RDI + 1));
      for (local_28 = 0; local_28 < uVar6; local_28 = local_28 + 1) {
        *local_20 = -1 - *local_20;
        local_20 = local_20 + 1;
      }
    }
  }
  return;
}

Assistant:

void TIFFDecoderImpl::nextScanline()
    {
        // eventually read a new strip
        if ( ++stripindex >= stripheight ) {
            stripindex = 0;

            if ( planarconfig == PLANARCONFIG_SEPARATE ) {
                const tsize_t size = TIFFScanlineSize(tiff);
                for( unsigned int i = 0; i < samples_per_pixel; ++i )
                    TIFFReadScanline(tiff, stripbuffer[i], scanline++, size);
            } else {
                TIFFReadScanline( tiff, stripbuffer[0], scanline++, 0);
            }

            // XXX handle bilevel images

            // invert grayscale images that interpret 0 as white
            if ( photometric == PHOTOMETRIC_MINISWHITE &&
                 samples_per_pixel == 1 && pixeltype == "UINT8" ) {

                UInt8 * buf = static_cast< UInt8 * >(stripbuffer[0]);
                const unsigned int n = TIFFScanlineSize(tiff);

                // invert every pixel
                for ( unsigned int i = 0; i < n; ++i, ++buf )
                    *buf = 0xff - *buf;
            }
        }
    }